

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Refal2::CParser::parsingInitial(CParser *this)

{
  code *pcVar1;
  allocator local_31;
  string local_30;
  
  switch((this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token.type) {
  case TT_None:
    __assert_fail("token.type != TT_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Parser.cpp"
                  ,0x1d,"void Refal2::CParser::parsingInitial()");
  case TT_Word:
    CRuleParser::EndFunction((CRuleParser *)this);
    CToken::Move(&(this->super_CDirectiveParser).super_CRuleParser.super_CQualifierParser.token,
                 &this->savedToken1);
    pcVar1 = parsingWord;
    break;
  case TT_Blank:
    pcVar1 = parsingBlank;
    break;
  default:
    std::__cxx11::string::string
              ((string *)&local_30,"line should begin with word or space",&local_31);
    error(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pcVar1 = parsingIgnoreLine;
    break;
  case TT_LineFeed:
    goto switchD_0012bf30_caseD_8;
  }
  this->state = (TState)pcVar1;
  *(undefined8 *)&this->field_0x1f68 = 0;
switchD_0012bf30_caseD_8:
  return;
}

Assistant:

void CParser::parsingInitial()
{
	assert( token.type != TT_None );
	if( token.type == TT_Word ) {
		CRuleParser::EndFunction(); // action
		token.Move( savedToken1 );
		state = &CParser::parsingWord;
	} else if( token.type == TT_Blank ) {
		state = &CParser::parsingBlank;
	} else if( token.type != TT_LineFeed ) {
		error( "line should begin with word or space" );
		state = &CParser::parsingIgnoreLine;
	}
}